

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TypeName_abi_cxx11_
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x656c676e61697254;
  in_RDI->_M_string_length = 8;
  (in_RDI->field_2)._M_local_buf[8] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }